

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

void __thiscall SQCompilation::CheckerVisitor::checkCanReturnNull(CheckerVisitor *this,BinExpr *bin)

{
  TreeOp TVar1;
  SQChar *n;
  bool bVar2;
  ulong in_RAX;
  Expr *pEVar3;
  Node *n_00;
  FunctionInfo *pFVar4;
  SQChar **ppSVar5;
  ulong uStack_28;
  bool isCtor;
  
  if (this->effectsOnly == false) {
    TVar1 = (bin->super_Expr).super_Node._op;
    if ((((ulong)TVar1 < 0x31) && ((0x1f7f800000000U >> ((ulong)TVar1 & 0x3f) & 1) != 0)) ||
       (TVar1 - TO_3CMP < 5)) {
      uStack_28 = in_RAX;
      pEVar3 = skipUnary(bin->_lhs);
      pEVar3 = maybeEval(this,pEVar3,false);
      n_00 = &skipUnary(pEVar3)->super_Node;
      pEVar3 = skipUnary(bin->_rhs);
      pEVar3 = maybeEval(this,pEVar3,false);
      if ((n_00->_op == TO_CALL) || (n_00 = &skipUnary(pEVar3)->super_Node, n_00->_op == TO_CALL)) {
        pEVar3 = (Expr *)n_00[1].super_ArenaObj._vptr_ArenaObj;
        uStack_28 = uStack_28 & 0xffffffffffffff;
        pFVar4 = findFunctionInfo(this,pEVar3,&isCtor);
        if (isCtor == false) {
          if (pFVar4 == (FunctionInfo *)0x0) {
            TVar1 = (pEVar3->super_Node)._op;
            if (TVar1 == TO_GETFIELD) {
              ppSVar5 = (SQChar **)&pEVar3[1].super_Node._coordinates.lineEnd;
            }
            else {
              if (TVar1 != TO_ID) {
                return;
              }
              ppSVar5 = (SQChar **)(pEVar3 + 1);
            }
          }
          else {
            ppSVar5 = &pFVar4->declaration->_name;
          }
          n = *ppSVar5;
          if ((n != (SQChar *)0x0) && (bVar2 = canFunctionReturnNull(n), bVar2)) {
            report(this,n_00,0x5e,n);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkCanReturnNull(const BinExpr *bin) {
  if (effectsOnly)
    return;


  if (!isPureArithOperator(bin->op()) && !isRelationOperator(bin->op())) {
    return;
  }

  const Expr *l = skipUnary(maybeEval(skipUnary(bin->lhs())));
  const Expr *r = skipUnary(maybeEval(skipUnary(bin->rhs())));
  const CallExpr *c = nullptr;

  if (l->op() == TO_CALL) // -V522
    c = static_cast<const CallExpr *>(l);
  else if (r->op() == TO_CALL) // -V522
    c = static_cast<const CallExpr *>(r);

  if (!c)
    return;

  const Expr *callee = c->callee();
  bool isCtor = false;
  const FunctionInfo *info = findFunctionInfo(callee, isCtor);

  if (isCtor)
    return;

  const SQChar *funcName = nullptr;

  if (info) {
    funcName = info->declaration->name();
  }
  else if (callee->op() == TO_ID) {
    funcName = callee->asId()->id();
  }
  else if (callee->op() == TO_GETFIELD) {
    funcName = callee->asGetField()->fieldName();
  }

  if (funcName) {
    if (canFunctionReturnNull(funcName)) {
      report(c, DiagnosticsId::DI_FUNC_CAN_RET_NULL, funcName);
    }
  }
}